

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiColor3D Read<aiColor3D>(IOStream *stream)

{
  DeadlyImportError *this;
  size_t in_RSI;
  undefined8 extraout_XMM0_Qa;
  ai_real in_XMM1_Da;
  aiColor3D aVar1;
  allocator local_41;
  string local_40;
  long local_20;
  size_t res;
  IOStream *stream_local;
  aiColor3D *t;
  
  res = in_RSI;
  stream_local = stream;
  aiColor3D::aiColor3D((aiColor3D *)stream);
  local_20 = (**(code **)(*(long *)res + 0x10))(res,stream,0xc,1);
  if (local_20 != 1) {
    this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Unexpected EOF",&local_41);
    DeadlyImportError::DeadlyImportError(this,&local_40);
    __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  aVar1.b = in_XMM1_Da;
  aVar1.r = (ai_real)(int)extraout_XMM0_Qa;
  aVar1.g = (ai_real)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return aVar1;
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}